

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alDeleteBuffers(ALsizei n,ALuint *names)

{
  ALuint name_00;
  BufferWrapper *pBVar1;
  byte bVar2;
  ALenum AVar3;
  BufferWrapper *__ptr;
  DeviceWrapper *local_38;
  BufferWrapper *buf;
  ALuint name;
  ALsizei i;
  DeviceWrapper *device;
  ALuint *names_local;
  ALsizei n_local;
  
  if (current_context == (ContextWrapper *)0x0) {
    local_38 = (DeviceWrapper *)0x0;
  }
  else {
    local_38 = current_context->device;
  }
  APILOCK();
  IO_ENTRYINFO(ALEE_alDeleteBuffers);
  IO_ALSIZEI(n);
  IO_PTR(names);
  for (buf._4_4_ = 0; buf._4_4_ < n; buf._4_4_ = buf._4_4_ + 1) {
    IO_UINT32(names[buf._4_4_]);
  }
  (*REAL_alDeleteBuffers)(n,names);
  AVar3 = check_al_error_events();
  if ((AVar3 == 0) && (local_38 != (DeviceWrapper *)0x0)) {
    for (buf._4_4_ = 0; buf._4_4_ < n; buf._4_4_ = buf._4_4_ + 1) {
      name_00 = names[buf._4_4_];
      __ptr = buffer_wrapped_lookup(name_00);
      if (__ptr != (BufferWrapper *)0x0) {
        if (__ptr->hash_prev == (BufferWrapper *)0x0) {
          pBVar1 = __ptr->hash_next;
          bVar2 = hash_alname(name_00);
          local_38->wrapped_buffer_hash[bVar2] = pBVar1;
        }
        else {
          __ptr->hash_prev->hash_next = __ptr->hash_next;
        }
        if (__ptr->hash_next != (BufferWrapper *)0x0) {
          __ptr->hash_next->hash_prev = __ptr->hash_prev;
        }
        free(__ptr);
      }
    }
  }
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alDeleteBuffers(ALsizei n, const ALuint *names)
{
    DeviceWrapper *device = current_context ? current_context->device : NULL;
    ALsizei i;

    IO_START(alDeleteBuffers);
    IO_ALSIZEI(n);
    IO_PTR(names);
    for (i = 0; i < n; i++) {
        IO_UINT32(names[i]);
    }

    REAL_alDeleteBuffers(n, names);

    // objects are only deleted if there are no errors.
    if (check_al_error_events() == AL_NO_ERROR) {
        if (device) {
            for (i = 0; i < n; i++) {
                const ALuint name = names[i];
                BufferWrapper *buf = buffer_wrapped_lookup(name);
                if (buf) {
                    if (buf->hash_prev) {
                        buf->hash_prev->hash_next = buf->hash_next;
                    } else {
                        device->wrapped_buffer_hash[hash_alname(name)] = buf->hash_next;
                    }
                    if (buf->hash_next) {
                        buf->hash_next->hash_prev = buf->hash_prev;
                    }
                    free(buf);
                }
            }
        }
    }

    IO_END();
}